

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_internal.h
# Opt level: O0

int exploration::
    generate_bag<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,ACTION_SCORE::score_iterator>
              (float *param_1,undefined8 param_2,score_iterator *param_3,score_iterator *param_4)

{
  bool bVar1;
  float *pfVar2;
  reference pfVar3;
  double dVar4;
  score_iterator d_1;
  float normalizer;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> t_a;
  score_iterator d;
  float num_models;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *in_stack_ffffffffffffff58
  ;
  float in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  uint uVar5;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  score_iterator local_78;
  float local_64;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_60;
  score_iterator local_58;
  undefined8 local_48;
  float *local_40;
  float local_34;
  score_iterator *local_30;
  score_iterator *local_28;
  undefined8 local_18;
  float *local_10;
  int local_4;
  
  __last._M_current = (float *)param_4;
  __first._M_current = (float *)param_3;
  local_30 = param_4;
  local_28 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  bVar1 = ACTION_SCORE::score_iterator::operator==(param_3,param_4);
  if ((bVar1) || (bVar1 = ACTION_SCORE::score_iterator::operator<(param_4,param_3), bVar1)) {
    local_4 = 1;
  }
  else {
    local_40 = local_10;
    local_48 = local_18;
    dVar4 = std::
            accumulate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                      (__first,__last,
                       (double)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_34 = (float)dVar4;
    if (1e-06 < local_34) {
      local_60._M_current = local_10;
      local_64 = 1.0 / local_34;
      ACTION_SCORE::score_iterator::score_iterator(&local_78,param_3);
      while( true ) {
        bVar1 = ACTION_SCORE::score_iterator::operator!=(&local_78,param_4);
        uVar5 = in_stack_ffffffffffffff64 & 0xffffff;
        if (bVar1) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                              *)(CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60) &
                                0xffffffffffffff),in_stack_ffffffffffffff58);
          uVar5 = CONCAT13(bVar1,(int3)uVar5);
        }
        in_stack_ffffffffffffff64 = uVar5;
        if ((char)(in_stack_ffffffffffffff64 >> 0x18) == '\0') break;
        pfVar3 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                 ::operator*(&local_60);
        in_stack_ffffffffffffff60 = *pfVar3 * local_64;
        pfVar2 = ACTION_SCORE::score_iterator::operator*(&local_78);
        *pfVar2 = in_stack_ffffffffffffff60;
        ACTION_SCORE::score_iterator::operator++(&local_78);
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&local_60);
      }
      local_4 = 0;
    }
    else {
      pfVar2 = ACTION_SCORE::score_iterator::operator*(param_3);
      *pfVar2 = 1.0;
      ACTION_SCORE::score_iterator::operator+
                ((score_iterator *)__last._M_current,
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      while (bVar1 = ACTION_SCORE::score_iterator::operator!=(&local_58,param_4), bVar1) {
        pfVar2 = ACTION_SCORE::score_iterator::operator*(&local_58);
        *pfVar2 = 0.0;
        ACTION_SCORE::score_iterator::operator++(&local_58);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int generate_bag(InputIt top_actions_first, InputIt top_actions_last, std::input_iterator_tag /* top_actions_tag */, OutputIt pdf_first, OutputIt pdf_last, std::random_access_iterator_tag /* pdf_tag */)
  {
    // iterators don't support <= in general
    if (pdf_first == pdf_last || pdf_last < pdf_first)
      return E_EXPLORATION_BAD_RANGE;

    float num_models = (float)std::accumulate(top_actions_first, top_actions_last, 0.);
    if (num_models <= 1e-6)
    {
      // based on above checks we have at least 1 element in pdf
      *pdf_first = 1;
      for (OutputIt d = pdf_first + 1; d != pdf_last; ++d)
        *d = 0;

      return S_EXPLORATION_OK;
    }

    // divide late to improve numeric stability
    InputIt t_a = top_actions_first;
    float normalizer = 1.f / num_models;
    for (OutputIt d = pdf_first; d != pdf_last && t_a != top_actions_last; ++d, ++t_a)
      *d = *t_a * normalizer;

    return S_EXPLORATION_OK;
  }